

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O0

size_t ClownLZSS::Internal::KosinskiPlus::GetMatchCost(size_t distance,size_t length,void *user)

{
  void *user_local;
  size_t length_local;
  size_t distance_local;
  
  if (((length < 2) || (5 < length)) || (0x100 < distance)) {
    if ((length < 3) || (9 < length)) {
      if (length < 10) {
        distance_local = 0;
      }
      else {
        distance_local = 0x1a;
      }
    }
    else {
      distance_local = 0x12;
    }
  }
  else {
    distance_local = 0xc;
  }
  return distance_local;
}

Assistant:

inline std::size_t GetMatchCost(const std::size_t distance, const std::size_t length, [[maybe_unused]] void* const user)
			{
				if (length >= 2 && length <= 5 && distance <= 0x100)
					return 2 + 8 + 2;  // Descriptor bits, offset byte, length bits.
				else if (length >= 3 && length <= 9)
					return 2 + 16;     // Descriptor bits, offset/length bytes.
				else if (length >= 10)
					return 2 + 16 + 8; // Descriptor bits, offset bytes, length byte.
				else
					return 0;          // In the event a match cannot be compressed.
			}